

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeIndexedVector.h
# Opt level: O2

void __thiscall
slang::
SafeIndexedVector<slang::ast::Scope::DeferredMemberData,_slang::ast::Scope::DeferredMemberIndex>::
SafeIndexedVector(SafeIndexedVector<slang::ast::Scope::DeferredMemberData,_slang::ast::Scope::DeferredMemberIndex>
                  *this)

{
  (this->storage).
  super__Vector_base<slang::ast::Scope::DeferredMemberData,_std::allocator<slang::ast::Scope::DeferredMemberData>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->storage).
  super__Vector_base<slang::ast::Scope::DeferredMemberData,_std::allocator<slang::ast::Scope::DeferredMemberData>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->storage).
  super__Vector_base<slang::ast::Scope::DeferredMemberData,_std::allocator<slang::ast::Scope::DeferredMemberData>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  _Deque_base<slang::ast::Scope::DeferredMemberIndex,_std::allocator<slang::ast::Scope::DeferredMemberIndex>_>
  ::_Deque_base(&(this->freelist).
                 super__Deque_base<slang::ast::Scope::DeferredMemberIndex,_std::allocator<slang::ast::Scope::DeferredMemberIndex>_>
               );
  std::
  vector<slang::ast::Scope::DeferredMemberData,_std::allocator<slang::ast::Scope::DeferredMemberData>_>
  ::emplace_back<>(&this->storage);
  return;
}

Assistant:

SafeIndexedVector() {
        // reserve a slot for the invalid value
        storage.emplace_back();
    }